

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_cvtps_pw_mips64el(CPUMIPSState_conflict10 *env,uint64_t dt0)

{
  float_status *status;
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  
  status = &(env->active_fpu).fp_status;
  fVar1 = int32_to_float32_mips64el((int32_t)dt0,status);
  fVar2 = int32_to_float32_mips64el((int32_t)(dt0 >> 0x20),status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

uint64_t helper_float_cvtps_pw(CPUMIPSState *env, uint64_t dt0)
{
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = int32_to_float32(dt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    fsth2 = int32_to_float32(dt0 >> 32, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}